

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O2

function<void_()> * scope_example2::f(void)

{
  function<void_()> *in_RDI;
  MyLogger capture_messages;
  Logger local_80;
  
  Logger::Logger(&local_80);
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  in_RDI->_M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/test/readme-test.cc:157:10)>
       ::_M_invoke;
  (in_RDI->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/test/readme-test.cc:157:10)>
       ::_M_manager;
  Logger::~Logger(&local_80);
  return in_RDI;
}

Assistant:

std::function<void()> f() {
  MyLogger capture_messages;
  return [] { MyLogger::Log("f was called"); };
}